

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O2

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MinId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,MinConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MinId>_>
          *prepro)

{
  Type TVar1;
  CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MinId> *va;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  va = &c->
        super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MinId>
  ;
  dVar4 = FlatModel<mp::DefaultFlatModelParams>::lb_array<std::vector<int,std::allocator<int>>>
                    ((FlatModel<mp::DefaultFlatModelParams> *)this,&va->args_);
  dVar5 = FlatModel<mp::DefaultFlatModelParams>::ub_min_array<std::vector<int,std::allocator<int>>>
                    ((FlatModel<mp::DefaultFlatModelParams> *)this,&va->args_);
  uVar2 = -(ulong)(prepro->lb_ < dVar4);
  uVar3 = -(ulong)(dVar5 < prepro->ub_);
  prepro->lb_ = (double)(~uVar2 & (ulong)prepro->lb_ | (ulong)dVar4 & uVar2);
  prepro->ub_ = (double)(~uVar3 & (ulong)prepro->ub_ | (ulong)dVar5 & uVar3);
  TVar1 = FlatModel<mp::DefaultFlatModelParams>::common_type<std::vector<int,std::allocator<int>>>
                    ((FlatModel<mp::DefaultFlatModelParams> *)this,&va->args_);
  prepro->type_ = TVar1;
  return;
}

Assistant:

void PreprocessConstraint(
      MinConstraint& c, PreprocessInfo& prepro) {
    auto& m = MP_DISPATCH( GetModel() );
    auto& args = c.GetArguments();
    prepro.narrow_result_bounds( m.lb_array(args),
                          m.ub_min_array(args) );
    prepro.set_result_type( m.common_type(args) );
  }